

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SyncLabelCase::iterate(SyncLabelCase *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  deBool dVar4;
  undefined4 extraout_var;
  undefined8 uVar6;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  int outlen;
  char buffer [64];
  MessageBuilder local_1a0;
  long lVar5;
  
  bVar2 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar2) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x728);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  outlen = -1;
  uVar6 = (**(code **)(lVar5 + 0x640))(0x9117,0);
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"fenceSync",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                  ,0x730);
  (**(code **)(lVar5 + 0xfc8))(uVar6,0xffffffffffffffff,"This is a debug label");
  builtin_strncpy(buffer + 0x30,"XXXXXXXXXXXXXXXX",0x10);
  builtin_strncpy(buffer + 0x20,"XXXXXXXXXXXXXXXX",0x10);
  builtin_strncpy(buffer + 0x10,"XXXXXXXXXXXXXXXX",0x10);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXX",0x10);
  (**(code **)(lVar5 + 0x960))(uVar6,0x40,&outlen);
  if (outlen == 0) {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Failed to query debug label from object";
  }
  else {
    dVar4 = deStringEqual("This is a debug label",buffer);
    if (dVar4 != 0) {
      local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1a0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Query returned string: \"");
      std::operator<<((ostream *)poVar1,buffer);
      std::operator<<((ostream *)poVar1,"\"");
      tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_003d9e57;
    }
    buffer._60_4_ = buffer._60_4_ & 0xffffff;
    local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Query returned wrong string: expected \"");
    std::operator<<((ostream *)poVar1,"This is a debug label");
    std::operator<<((ostream *)poVar1,"\" but got \"");
    std::operator<<((ostream *)poVar1,buffer);
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Query returned wrong label";
  }
  testResult = QP_TEST_RESULT_FAIL;
LAB_003d9e57:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  (**(code **)(lVar5 + 0x478))(uVar6);
  return STOP;
}

Assistant:

SyncLabelCase::IterateResult SyncLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	char					buffer[64];

	glw::GLsync				sync		= gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "fenceSync");

	gl.objectPtrLabel(sync, -1, msg);

	deMemset(buffer, 'X', sizeof(buffer));
	gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);

	if (outlen == 0)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to query debug label from object");
	else if (deStringEqual(msg, buffer))
	{
		m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		buffer[63] = '\0'; // make sure buffer is null terminated before printing
		m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << msg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query returned wrong label");
	}

	gl.deleteSync(sync);

	return STOP;
}